

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> * __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets
          (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           *__return_storage_ptr__,cmGlobalGenerator *this)

{
  pointer ppcVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  char *pcVar8;
  bool bVar9;
  pointer ppcVar10;
  uint uVar11;
  ulong uVar12;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> filteredTargets;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmGeneratorTarget *gt;
  string qtMajorVersion;
  allocator local_104;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *local_100;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_f8;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_d8;
  cmGlobalGenerator *local_c0;
  ulong local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = 0;
  local_100 = __return_storage_ptr__;
  local_c0 = this;
  do {
    uVar12 = (ulong)uVar11;
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar12) {
      return local_100;
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_d8,
               &ppcVar1[uVar12]->GeneratorTargets);
    local_f8._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8 = uVar12;
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_f8,
               (long)local_d8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8._M_impl.super__Vector_impl_data._M_start >> 3);
    for (ppcVar10 = local_d8._M_impl.super__Vector_impl_data._M_start; uVar12 = local_b8,
        this = local_c0, ppcVar10 != local_d8._M_impl.super__Vector_impl_data._M_finish;
        ppcVar10 = ppcVar10 + 1) {
      TVar7 = cmGeneratorTarget::GetType(*ppcVar10);
      if ((TVar7 != GLOBAL_TARGET) &&
         ((((TVar7 = cmGeneratorTarget::GetType(*ppcVar10), TVar7 == EXECUTABLE ||
            (TVar7 = cmGeneratorTarget::GetType(*ppcVar10), TVar7 == STATIC_LIBRARY)) ||
           (TVar7 = cmGeneratorTarget::GetType(*ppcVar10), TVar7 == SHARED_LIBRARY)) ||
          ((TVar7 = cmGeneratorTarget::GetType(*ppcVar10), TVar7 == MODULE_LIBRARY ||
           (TVar7 = cmGeneratorTarget::GetType(*ppcVar10), TVar7 == OBJECT_LIBRARY)))))) {
        pcVar2 = *ppcVar10;
        std::__cxx11::string::string((string *)&local_90,"AUTOMOC",(allocator *)&local_b0);
        bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_90);
        if (bVar3) {
LAB_0034a5db:
          bVar4 = false;
LAB_0034a5dd:
          bVar9 = !bVar3;
          bVar5 = cmGeneratorTarget::IsImported(*ppcVar10);
          if (bVar4) goto LAB_0034a630;
          if (!bVar3) goto LAB_0034a642;
        }
        else {
          pcVar2 = *ppcVar10;
          std::__cxx11::string::string((string *)&local_50,"AUTOUIC",&local_101);
          bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_50);
          if (bVar4) goto LAB_0034a5db;
          pcVar2 = *ppcVar10;
          std::__cxx11::string::string((string *)&local_70,"AUTORCC",&local_102);
          bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_70);
          bVar4 = true;
          bVar5 = true;
          bVar9 = true;
          if (bVar6) goto LAB_0034a5dd;
LAB_0034a630:
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar9) {
LAB_0034a642:
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
        std::__cxx11::string::~string((string *)&local_90);
        if (bVar5 == false) {
          this_00 = (*ppcVar10)->Target->Makefile;
          std::__cxx11::string::string((string *)&local_b0,"QT_VERSION_MAJOR",&local_104);
          pcVar8 = cmMakefile::GetSafeDefinition(this_00,&local_b0);
          std::__cxx11::string::string((string *)&local_90,pcVar8,&local_103);
          std::__cxx11::string::~string((string *)&local_b0);
          bVar3 = std::operator==(&local_90,"");
          if (bVar3) {
            std::__cxx11::string::string((string *)&local_b0,"Qt5Core_VERSION_MAJOR",&local_104);
            cmMakefile::GetSafeDefinition(this_00,&local_b0);
            std::__cxx11::string::assign((char *)&local_90);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          bVar3 = std::operator!=(&local_90,"4");
          if ((!bVar3) || (bVar3 = std::operator!=(&local_90,"5"), !bVar3)) {
            local_b0._M_dataplus._M_p = (pointer)*ppcVar10;
            cmQtAutoGeneratorInitializer::InitializeAutogenSources
                      ((cmGeneratorTarget *)local_b0._M_dataplus._M_p);
            std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                      ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                       &local_f8,(value_type *)&local_b0);
          }
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
    }
    for (ppcVar10 = local_f8._M_impl.super__Vector_impl_data._M_start;
        ppcVar10 != local_f8._M_impl.super__Vector_impl_data._M_finish; ppcVar10 = ppcVar10 + 1) {
      cmQtAutoGeneratorInitializer::InitializeAutogenTarget
                ((this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar12],*ppcVar10);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (local_100,ppcVar10);
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_f8);
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_d8);
    uVar11 = (int)uVar12 + 1;
  } while( true );
}

Assistant:

std::vector<const cmGeneratorTarget*>
cmGlobalGenerator::CreateQtAutoGeneratorsTargets()
{
  std::vector<const cmGeneratorTarget*> autogenTargets;

#ifdef CMAKE_BUILD_WITH_CMAKE
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    std::vector<cmGeneratorTarget*> targets =
      this->LocalGenerators[i]->GetGeneratorTargets();
    std::vector<cmGeneratorTarget*> filteredTargets;
    filteredTargets.reserve(targets.size());
    for(std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      if ((*ti)->GetType() == cmState::GLOBAL_TARGET)
        {
        continue;
        }
      if((*ti)->GetType() != cmState::EXECUTABLE &&
         (*ti)->GetType() != cmState::STATIC_LIBRARY &&
         (*ti)->GetType() != cmState::SHARED_LIBRARY &&
         (*ti)->GetType() != cmState::MODULE_LIBRARY &&
         (*ti)->GetType() != cmState::OBJECT_LIBRARY)
        {
        continue;
        }
      if((!(*ti)->GetPropertyAsBool("AUTOMOC")
            && !(*ti)->GetPropertyAsBool("AUTOUIC")
            && !(*ti)->GetPropertyAsBool("AUTORCC"))
          || (*ti)->IsImported())
        {
        continue;
        }
      // don't do anything if there is no Qt4 or Qt5Core (which contains moc):
      cmMakefile* mf = (*ti)->Target->GetMakefile();
      std::string qtMajorVersion = mf->GetSafeDefinition("QT_VERSION_MAJOR");
      if (qtMajorVersion == "")
        {
        qtMajorVersion = mf->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
        }
      if (qtMajorVersion != "4" && qtMajorVersion != "5")
        {
        continue;
        }

      cmGeneratorTarget* gt = *ti;

      cmQtAutoGeneratorInitializer::InitializeAutogenSources(gt);
      filteredTargets.push_back(gt);
      }
    for(std::vector<cmGeneratorTarget*>::iterator ti = filteredTargets.begin();
        ti != filteredTargets.end(); ++ti)
      {
      cmQtAutoGeneratorInitializer::InitializeAutogenTarget(
           this->LocalGenerators[i], *ti);
      autogenTargets.push_back(*ti);
      }
    }
#endif
  return autogenTargets;
}